

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O1

bool __thiscall RTIMUBMX055::setMagPreset(RTIMUBMX055 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  byte bVar3;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_BMX055MagPreset;
  if (uVar1 < 4) {
    bVar3 = (byte)(uVar1 << 3);
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_magSlaveAddr,'L','\0',
                               "Failed to set BMX055 mag mode");
    if (bVar2) {
      bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_magSlaveAddr,'Q',(uchar)(0x17070401 >> (bVar3 & 0x1f)),
                                 "Failed to set BMX055 mag repXY");
      if (bVar2) {
        bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_magSlaveAddr,'R',(uchar)(0x521a0e02 >> (bVar3 & 0x1f)),
                                   "Failed to set BMX055 mag repZ");
        return bVar2;
      }
    }
  }
  else {
    fprintf(_stderr,"Illegal BMX055 mag preset code %d\n",(ulong)uVar1);
  }
  return false;
}

Assistant:

bool RTIMUBMX055::setMagPreset()
{
    unsigned char mode, repXY, repZ;

    switch (m_settings->m_BMX055MagPreset) {
    case BMX055_MAG_LOW_POWER:                              // ODR=10, RepXY=3, RepZ=3
        mode = 0;
        repXY = 1;
        repZ = 2;
        break;

    case BMX055_MAG_REGULAR:                                // ODR=10, RepXY=9, RepZ=15
        mode = 0;
        repXY = 4;
        repZ = 14;
        break;

    case BMX055_MAG_ENHANCED:                               // ODR=10, RepXY=15, RepZ=27
        mode = 0;
        repXY = 7;
        repZ = 26;
        break;

    case BMX055_MAG_HIGH_ACCURACY:                          // ODR=10, RepXY=47, RepZ=83
        mode = 0;
        repXY = 23;
        repZ = 82;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 mag preset code %d\n", m_settings->m_BMX055MagPreset);
        return false;
    }

    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_MODE, mode, "Failed to set BMX055 mag mode"))
        return false;
    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_REPXY, repXY, "Failed to set BMX055 mag repXY"))
        return false;
    if (!m_settings->HALWrite(m_magSlaveAddr, BMX055_MAG_REPZ, repZ, "Failed to set BMX055 mag repZ"))
        return false;
    return true;
}